

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall TApp_IniFailure_Test::~TApp_IniFailure_Test(TApp_IniFailure_Test *this)

{
  TApp_IniFailure_Test *this_local;
  
  ~TApp_IniFailure_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, IniFailure) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "val=1" << std::endl;
    }

    EXPECT_THROW(run(), CLI::INIError);
}